

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_std_string_format.cpp
# Opt level: O0

wstring * ON_std_wstring_format_abi_cxx11_(wstring *__return_storage_ptr__,wchar_t *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_2128 [16];
  undefined8 local_2118;
  undefined8 local_2110;
  undefined8 local_2108;
  undefined8 local_2100;
  undefined8 local_20f8;
  undefined8 local_20e8;
  undefined8 local_20d8;
  undefined8 local_20c8;
  undefined8 local_20b8;
  undefined8 local_20a8;
  undefined8 local_2098;
  undefined8 local_2088;
  exception *anon_var_0;
  undefined1 local_2058 [8];
  va_list args;
  undefined1 auStack_2038 [4];
  int n;
  ON_wStringBuffer buffer;
  wchar_t stack_buffer [2048];
  wchar_t *format_local;
  wstring *str;
  
  if (in_AL != '\0') {
    local_20f8 = in_XMM0_Qa;
    local_20e8 = in_XMM1_Qa;
    local_20d8 = in_XMM2_Qa;
    local_20c8 = in_XMM3_Qa;
    local_20b8 = in_XMM4_Qa;
    local_20a8 = in_XMM5_Qa;
    local_2098 = in_XMM6_Qa;
    local_2088 = in_XMM7_Qa;
  }
  local_2118 = in_RDX;
  local_2110 = in_RCX;
  local_2108 = in_R8;
  local_2100 = in_R9;
  ON_wStringBuffer::ON_wStringBuffer
            ((ON_wStringBuffer *)auStack_2038,(wchar_t *)&buffer.m_heap_buffer_capacity,0x800);
  args[0].reg_save_area._4_4_ = 0;
  args[0].reg_save_area._3_1_ = 0;
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  if ((format != (wchar_t *)0x0) || (iRam0000000000000000 != 0)) {
    args[0].overflow_arg_area = local_2128;
    args[0]._0_8_ = &stack0x00000008;
    local_2058._4_4_ = 0x30;
    local_2058._0_4_ = 0x10;
    args[0].reg_save_area._4_4_ =
         ON_wString::FormatVargsIntoBuffer
                   ((ON_wStringBuffer *)auStack_2038,format,(__va_list_tag *)local_2058);
  }
  if (0 < args[0].reg_save_area._4_4_) {
    std::__cxx11::wstring::append((wchar_t *)__return_storage_ptr__,(ulong)_auStack_2038);
  }
  args[0].reg_save_area._3_1_ = 1;
  ON_wStringBuffer::~ON_wStringBuffer((ON_wStringBuffer *)auStack_2038);
  return __return_storage_ptr__;
}

Assistant:

std::wstring ON_VARGS_FUNC_CDECL ON_std_wstring_format(const wchar_t* format, ...) ON_NOEXCEPT
{
  wchar_t stack_buffer[2048];
  ON_wStringBuffer buffer(stack_buffer, sizeof(stack_buffer) / sizeof(stack_buffer[0]));
  int n = 0;
  std::wstring str;

  if (0 != format || 0 != format[0])
  {
    va_list args;
    va_start(args, format);
    n = ON_wString::FormatVargsIntoBuffer(buffer, format, args);
    va_end(args);
  }

  if ( n > 0 )
  {
    // exceptions are swallowed.
    try { str.append(buffer.m_buffer, n); }
    catch (const std::exception& ) {}
  }

  return str;
}